

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O3

void __thiscall
cmCTestMultiProcessHandler::CreateSerialTestCostList(cmCTestMultiProcessHandler *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  iterator iVar3;
  pointer piVar4;
  _Base_ptr p_Var5;
  long lVar6;
  int *__buffer;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var10;
  pointer piVar11;
  pair<int_*,_long> pVar12;
  int test;
  int testDependency;
  TestList presortedList;
  TestList dependencies;
  TestSet alreadySortedTests;
  int local_c0;
  int local_bc;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_b8;
  iterator iStack_b0;
  int *local_a8;
  TestList local_98;
  vector<int,std::allocator<int>> *local_78;
  int *local_70;
  int *local_68;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  local_b8._M_current = (int *)0x0;
  iStack_b0._M_current = (int *)0x0;
  local_a8 = (int *)0x0;
  p_Var5 = (this->Tests).
           super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->Tests).
            super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var1) {
    do {
      if (iStack_b0._M_current == local_a8) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_b8,iStack_b0,(int *)(p_Var5 + 1));
      }
      else {
        *iStack_b0._M_current = p_Var5[1]._M_color;
        iStack_b0._M_current = iStack_b0._M_current + 1;
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      iVar3._M_current = iStack_b0._M_current;
      _Var10._M_current = local_b8._M_current;
    } while ((_Rb_tree_header *)p_Var5 != p_Var1);
    if (local_b8._M_current != iStack_b0._M_current) {
      lVar6 = (long)iStack_b0._M_current - (long)local_b8._M_current >> 2;
      pVar12 = std::get_temporary_buffer<int>((lVar6 - (lVar6 + 1 >> 0x3f)) + 1 >> 1);
      lVar6 = pVar12.second;
      __buffer = pVar12.first;
      if (__buffer == (int *)0x0) {
        lVar6 = 0;
        std::
        __inplace_stable_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<TestComparator>>
                  (_Var10,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                          iVar3._M_current,(_Iter_comp_iter<TestComparator>)this);
      }
      else {
        std::
        __stable_sort_adaptive<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int*,long,__gnu_cxx::__ops::_Iter_comp_iter<TestComparator>>
                  (_Var10,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                          iVar3._M_current,__buffer,lVar6,(_Iter_comp_iter<TestComparator>)this);
      }
      operator_delete(__buffer,lVar6 << 2);
    }
  }
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_70 = iStack_b0._M_current;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (local_b8._M_current != iStack_b0._M_current) {
    local_78 = (vector<int,std::allocator<int>> *)&this->SortedTests;
    _Var10._M_current = local_b8._M_current;
    do {
      local_c0 = *_Var10._M_current;
      p_Var5 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var9 = &p_Var1->_M_header;
      if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_001df3ff:
        local_98.super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
             (int *)0x0;
        local_98.super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
             (int *)0x0;
        local_98.super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        GetAllTestDependencies(this,local_c0,&local_98);
        piVar4 = local_98.super_vector<int,_std::allocator<int>_>.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish;
        local_68 = _Var10._M_current;
        for (piVar11 = local_98.super_vector<int,_std::allocator<int>_>.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start; piVar11 != piVar4; piVar11 = piVar11 + 1) {
          local_bc = *piVar11;
          p_Var5 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var9 = &p_Var1->_M_header;
          if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_001df47b:
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       &local_60,&local_bc);
            iVar3._M_current =
                 (this->SortedTests).super_vector<int,_std::allocator<int>_>.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish;
            if (iVar3._M_current ==
                (this->SortedTests).super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (local_78,iVar3,&local_bc);
            }
            else {
              *iVar3._M_current = local_bc;
              (this->SortedTests).super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish = iVar3._M_current + 1;
            }
          }
          else {
            do {
              p_Var8 = p_Var9;
              p_Var7 = p_Var5;
              _Var2 = p_Var7[1]._M_color;
              p_Var9 = p_Var7;
              if ((int)_Var2 < local_bc) {
                p_Var9 = p_Var8;
              }
              p_Var5 = (&p_Var7->_M_left)[(int)_Var2 < local_bc];
            } while ((&p_Var7->_M_left)[(int)_Var2 < local_bc] != (_Base_ptr)0x0);
            if ((_Rb_tree_header *)p_Var9 == p_Var1) goto LAB_001df47b;
            if ((int)_Var2 < local_bc) {
              p_Var7 = p_Var8;
            }
            if (local_bc < (int)p_Var7[1]._M_color) goto LAB_001df47b;
          }
        }
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &local_60,&local_c0);
        _Var10._M_current = local_68;
        iVar3._M_current =
             (this->SortedTests).super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
        ;
        if (iVar3._M_current ==
            (this->SortedTests).super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (local_78,iVar3,&local_c0);
        }
        else {
          *iVar3._M_current = local_c0;
          (this->SortedTests).super_vector<int,_std::allocator<int>_>.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
               iVar3._M_current + 1;
        }
        if (local_98.super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            != (int *)0x0) {
          operator_delete(local_98.super_vector<int,_std::allocator<int>_>.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_98.super_vector<int,_std::allocator<int>_>.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_98.super_vector<int,_std::allocator<int>_>.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
      }
      else {
        do {
          p_Var8 = p_Var9;
          p_Var7 = p_Var5;
          _Var2 = p_Var7[1]._M_color;
          p_Var9 = p_Var7;
          if ((int)_Var2 < local_c0) {
            p_Var9 = p_Var8;
          }
          p_Var5 = (&p_Var7->_M_left)[(int)_Var2 < local_c0];
        } while ((&p_Var7->_M_left)[(int)_Var2 < local_c0] != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var9 == p_Var1) goto LAB_001df3ff;
        if ((int)_Var2 < local_c0) {
          p_Var7 = p_Var8;
        }
        if (local_c0 < (int)p_Var7[1]._M_color) goto LAB_001df3ff;
      }
      _Var10._M_current = _Var10._M_current + 1;
    } while (_Var10._M_current != local_70);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  if (local_b8._M_current != (int *)0x0) {
    operator_delete(local_b8._M_current,(long)local_a8 - (long)local_b8._M_current);
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::CreateSerialTestCostList()
{
  TestList presortedList;

  for (auto const& i : this->Tests) {
    presortedList.push_back(i.first);
  }

  std::stable_sort(presortedList.begin(), presortedList.end(),
                   TestComparator(this));

  TestSet alreadySortedTests;

  for (int test : presortedList) {
    if (alreadySortedTests.find(test) != alreadySortedTests.end()) {
      continue;
    }

    TestList dependencies;
    GetAllTestDependencies(test, dependencies);

    for (int testDependency : dependencies) {
      if (alreadySortedTests.find(testDependency) ==
          alreadySortedTests.end()) {
        alreadySortedTests.insert(testDependency);
        this->SortedTests.push_back(testDependency);
      }
    }

    alreadySortedTests.insert(test);
    this->SortedTests.push_back(test);
  }
}